

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  ostream *poVar7;
  long in_RSI;
  int in_EDI;
  int i;
  string command_str;
  string argv_1;
  char **argv_subcommand;
  int argc_subcommand;
  const_iterator command;
  int padding;
  int min_padding;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>
  *cmd;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
  *__range1;
  int max_command_len;
  string help_string;
  WSA wsa;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  int iVar8;
  const_iterator in_stack_fffffffffffffc98;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_char_**)>
  *in_stack_fffffffffffffca0;
  size_type in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc0;
  undefined6 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffcce;
  undefined1 in_stack_fffffffffffffccf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *in_stack_fffffffffffffcd8;
  int local_2e4;
  string local_2e0 [32];
  _Self local_2c0;
  allocator<char> local_2b1;
  string local_2b0 [32];
  _Base_ptr local_290;
  int local_288;
  allocator<char> local_281;
  string local_280 [32];
  long local_260;
  int local_258;
  allocator<char> local_251;
  string local_250 [32];
  _Self local_230;
  allocator<char> local_221;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  int local_d8;
  undefined4 local_d4;
  reference local_d0;
  _Self local_c8;
  _Self local_c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
  *local_b8;
  int local_b0;
  allocator<char> local_99;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  WSA local_11;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  WSA::WSA(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcd0,
             (char *)CONCAT17(in_stack_fffffffffffffccf,
                              CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
             (allocator<char> *)in_stack_fffffffffffffcc0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc98._M_node,(char *)in_stack_fffffffffffffc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc98._M_node,(char *)in_stack_fffffffffffffc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc98._M_node,(char *)in_stack_fffffffffffffc90);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  local_b0 = getMaxCommandLen<std::__cxx11::string,Command>
                       ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
                         *)in_stack_fffffffffffffcb0);
  local_b8 = &commands_abi_cxx11_;
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
                *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
              *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  while (bVar1 = std::operator!=(&local_c0,&local_c8), bVar1) {
    local_d0 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>
                            *)0x12d998);
    iVar8 = local_b0;
    local_d4 = 3;
    iVar4 = std::__cxx11::string::length();
    local_d8 = (iVar8 - iVar4) + 3;
    std::operator+(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
               (char)((ulong)in_stack_fffffffffffffca0 >> 0x38),
               (allocator<char> *)in_stack_fffffffffffffc98._M_node);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffccf,
                            CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
                   in_stack_fffffffffffffcc0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc98._M_node,in_stack_fffffffffffffc90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc98._M_node,(char *)in_stack_fffffffffffffc90);
    std::__cxx11::string::operator+=(local_38,local_f8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator(&local_179);
    std::__cxx11::string::~string(local_158);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>
                  *)in_stack_fffffffffffffc90);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcd0,
             (char *)CONCAT17(in_stack_fffffffffffffccf,
                              CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
             (allocator<char> *)in_stack_fffffffffffffcc0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc98._M_node,(char *)in_stack_fffffffffffffc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc98._M_node,(char *)in_stack_fffffffffffffc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc98._M_node,(char *)in_stack_fffffffffffffc90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc98._M_node,(char *)in_stack_fffffffffffffc90);
  std::__cxx11::string::operator+=(local_38,local_1a0);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcd0,
             (char *)CONCAT17(in_stack_fffffffffffffccf,
                              CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
             (allocator<char> *)in_stack_fffffffffffffcc0);
  local_230._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
               *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),(key_type *)0x12ddc7)
  ;
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  local_258 = local_8 + -1;
  local_260 = local_10 + 8;
  if (1 < local_8) {
    this = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_10 + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)CONCAT17(in_stack_fffffffffffffccf,
                                     CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)),
               (allocator<char> *)in_stack_fffffffffffffcc0);
    std::allocator<char>::~allocator(&local_281);
    uVar2 = std::operator==(in_stack_fffffffffffffc90,
                            (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (((bool)uVar2) ||
       (uVar3 = std::operator==(in_stack_fffffffffffffc90,
                                (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88
                                                )), (bool)uVar3)) {
      poVar7 = std::operator<<((ostream *)&std::cout,local_38);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
      local_288 = 1;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffc90,
                              (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
      ;
      if (bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cout,"2.0.1");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        local_4 = 0;
        local_288 = 1;
      }
      else {
        uVar5 = std::__cxx11::string::empty();
        if (((uVar5 & 1) == 0) &&
           (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_280), *pcVar6 != '-')) {
          in_stack_fffffffffffffca0 =
               *(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_char_**)>
                 **)(local_10 + 8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this,(char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffcc8)),
                     (allocator<char> *)in_stack_fffffffffffffcc0);
          in_stack_fffffffffffffc98 =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
                       *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                      (key_type *)0x12e156);
          local_290 = in_stack_fffffffffffffc98._M_node;
          local_230._M_node = in_stack_fffffffffffffc98._M_node;
          std::__cxx11::string::~string(local_2b0);
          std::allocator<char>::~allocator(&local_2b1);
          local_258 = local_258 + -1;
          local_260 = local_260 + 8;
        }
        local_288 = 0;
      }
    }
    std::__cxx11::string::~string(local_280);
    if (local_288 != 0) goto LAB_0012e3df;
  }
  local_2c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
              *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  bVar1 = std::operator==(&local_230,&local_2c0);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"Invalid command\n");
    poVar7 = std::operator<<((ostream *)&std::cerr,local_38);
    std::operator<<(poVar7,'\n');
    local_4 = 1;
    local_288 = 1;
  }
  else {
    std::__cxx11::string::string(local_2e0);
    for (local_2e4 = 0; iVar8 = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20),
        local_2e4 < local_8 - local_258; local_2e4 = local_2e4 + 1) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::operator+=(local_2e0,' ');
      }
      std::__cxx11::string::operator+=(local_2e0,*(char **)(local_10 + (long)local_2e4 * 8));
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>
                  *)0x12e393);
    local_4 = std::
              function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_char_**)>
              ::operator()(in_stack_fffffffffffffca0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc98._M_node,iVar8,
                           (char **)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    local_288 = 1;
    std::__cxx11::string::~string(local_2e0);
  }
LAB_0012e3df:
  std::__cxx11::string::~string(local_38);
  WSA::~WSA(&local_11);
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
  WSA wsa;

  std::string help_string = std::string("Usage: ") +
      argv[0] + " [-h | --help] [--version] <command> [<args>]\n\n" +
      "Available commands are:\n";

  const int max_command_len = getMaxCommandLen(commands);
  for (const auto &cmd : commands)
  {
    const int min_padding = 3;
    const int padding =
        max_command_len + min_padding - static_cast<int>(cmd.first.length());
    help_string += "    " + cmd.first +
                   std::string(static_cast<std::size_t>(padding), ' ') +
                   cmd.second.description + "\n";
  }

  help_string += std::string("\n") +
      "If no command is given, 'ls' is assumed.\n" +
      "See '" + argv[0] + " <command> --help' for command-specific help.";

  auto command = commands.find("ls");

  int argc_subcommand = argc - 1;
  char **argv_subcommand = argv + 1;

  if (argc > 1)
  {
    const std::string argv_1(argv[1]);
    if (argv_1 == "--help" || argv_1 == "-h")
    {
      std::cout << help_string << std::endl;
      return 0;
    }
    if (argv_1 == "--version")
    {
      std::cout << PACKAGE_VERSION << std::endl;
      return 0;
    }

    if (!argv_1.empty() && argv_1[0] != '-')
    {
      command = commands.find(argv[1]);
      --argc_subcommand;
      ++argv_subcommand;
    }
  }

  if (command == commands.end())
  {
    std::cerr << "Invalid command\n";
    std::cerr << help_string << '\n';
    return 1;
  }

  std::string command_str;
  for (int i = 0; i < (argc - argc_subcommand); ++i)
  {
    if (!command_str.empty())
    { command_str += ' '; }
    command_str += argv[i];
  }

  return command->second.fun(command_str, argc_subcommand, argv_subcommand);
}